

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  size_t in_RCX;
  allocator local_139;
  string local_138 [32];
  Scalar local_118;
  Scalar local_110;
  Scalar local_108;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_100;
  int local_e0;
  int local_dc;
  int j_2;
  int i_2;
  Scalar local_d0;
  Scalar local_c8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_c0;
  int local_a0;
  int local_9c;
  int j_1;
  int i_1;
  Scalar local_90;
  Scalar local_88 [3];
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_70;
  int local_50;
  int local_4c;
  int j;
  int i;
  undefined1 local_40 [8];
  ppm_image image;
  char **argv_local;
  int argc_local;
  
  i = 0x100;
  j = 0x100;
  image._32_8_ = argv;
  sisl::utility::ppm_image::ppm_image((ppm_image *)local_40,&i,&j);
  for (local_4c = 0; local_4c < 10; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
      pDVar1 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               sisl::utility::ppm_image::operator()((ppm_image *)local_40,&local_4c,&local_50);
      local_88[0] = 1.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_70,pDVar1,local_88);
      local_90 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_70,&local_90);
      _j_1 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar2,(Scalar *)&j_1);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_70)
      ;
    }
  }
  for (local_9c = 10; local_9c < 0x14; local_9c = local_9c + 1) {
    for (local_a0 = 0; local_a0 < 10; local_a0 = local_a0 + 1) {
      pDVar1 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               sisl::utility::ppm_image::operator()((ppm_image *)local_40,&local_9c,&local_a0);
      local_c8 = 0.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_c0,pDVar1,&local_c8);
      local_d0 = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_c0,&local_d0);
      _j_2 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                (pCVar2,(Scalar *)&j_2);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_c0)
      ;
    }
  }
  for (local_dc = 0x14; local_dc < 0x1e; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < 10; local_e0 = local_e0 + 1) {
      pDVar1 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               sisl::utility::ppm_image::operator()((ppm_image *)local_40,&local_dc,&local_e0);
      local_108 = 0.0;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
                (&local_100,pDVar1,&local_108);
      local_110 = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                         (&local_100,&local_110);
      local_118 = 1.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_118)
      ;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                (&local_100);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"200_output.ppm",&local_139);
  sisl::utility::ppm_image::write((ppm_image *)local_40,(int)local_138,(void *)0x1,in_RCX);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  sisl::utility::ppm_image::~ppm_image((ppm_image *)local_40);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	// The most simple way to output an image
	// in sisl, is to create a ppm image object
	sisl::utility::ppm_image image(256, 256);


	// then fill in its cells with pixel rgb values
	// images start at 0,0 top left
	
	// square 1
	for(int i = 0; i < 10; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 1.0, 0.0, 0.0; // all red
		}

	// square 2
	for(int i = 10; i < 20; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 1.0, 0.0; // all green
		}

	// square 3
	for(int i = 20; i < 30; i++)
		for(int j = 0; j < 10; j++) {
			image(i,j) << 0.0, 0.0, 1.0; // all blue
		}

	image.write("200_output.ppm");
	return 0;
}